

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedStringFieldGenerator::GenerateMembers
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  
  pmVar1 = &this->variables_;
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  if ((*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) == '\x01') &&
     (*(int *)(*(long *)(*(long *)(*(long *)(this->descriptor_ + 0x38) + 0x10) + 0x88) + 0x50) != 2)
     ) {
    google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
    return;
  }
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.LazyStringList $name$_;\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<java.lang.String>\n"
    "    get$capitalized_name$List() {\n"
    "  return $name$_;\n"   // note:  unmodifiable list
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$(int index) {\n"
    "  return $name$_.get(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes(int index) {\n"
    "  return $name$_.getByteString(index);\n"
    "}\n");

  if (descriptor_->options().packed() &&
      HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_,
      "private int $name$MemoizedSerializedSize = -1;\n");
  }
}